

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh_fixture.c
# Opt level: O0

int build_openssh_server_docker_image(void)

{
  int iVar1;
  char *pcVar2;
  int ret;
  char *container_image_name;
  char buildcmd [1024];
  int local_c;
  
  if (have_docker == 0) {
    local_c = 0;
  }
  else {
    pcVar2 = openssh_server_image();
    if (((pcVar2 == (char *)0x0) ||
        (iVar1 = run_command((char **)0x0,"docker pull %s",pcVar2), iVar1 != 0)) ||
       (iVar1 = run_command((char **)0x0,"docker tag %s libssh2/openssh_server",pcVar2), iVar1 != 0)
       ) {
      buildcmd[0x3f7] = '\0';
      pcVar2 = srcdir_path("openssh_server");
      snprintf((char *)&container_image_name,0x3ff,
               "docker build --quiet -t libssh2/openssh_server %s",pcVar2);
      local_c = run_command((char **)0x0,(char *)&container_image_name);
    }
    else {
      local_c = 0;
    }
  }
  return local_c;
}

Assistant:

static int build_openssh_server_docker_image(void)
{
    if(have_docker) {
        char buildcmd[1024];
        const char *container_image_name = openssh_server_image();
        if(container_image_name) {
            int ret = run_command(NULL, "docker pull %s",
                                  container_image_name);
            if(ret == 0) {
                ret = run_command(NULL, "docker tag %s libssh2/openssh_server",
                                  container_image_name);
                if(ret == 0) {
                    return ret;
                }
            }
        }
        buildcmd[sizeof(buildcmd)-1] = 0;
        snprintf(buildcmd, sizeof(buildcmd)-1,
                 "docker build --quiet -t libssh2/openssh_server %s",
                 srcdir_path("openssh_server"));

        return run_command(NULL, buildcmd);
    }
    else {
        return 0;
    }
}